

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

void __thiscall duckdb::Pipeline::ResetSource(Pipeline *this,bool force)

{
  optional_ptr<duckdb::PhysicalOperator,_true> *this_00;
  PhysicalOperator *pPVar1;
  _Head_base<0UL,_duckdb::GlobalSourceState_*,_false> _Var2;
  _Alloc_hider _Var3;
  int iVar4;
  InternalException *this_01;
  string local_40;
  
  this_00 = &this->source;
  if ((this->source).ptr != (PhysicalOperator *)0x0) {
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_00);
    iVar4 = (*this_00->ptr->_vptr_PhysicalOperator[0x13])();
    if ((char)iVar4 == '\0') {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Source of pipeline does not have IsSource set","");
      InternalException::InternalException(this_01,&local_40);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if ((force) ||
     ((this->source_state).
      super_unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
      .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl ==
      (GlobalSourceState *)0x0)) {
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_00);
    pPVar1 = (this->source).ptr;
    (*pPVar1->_vptr_PhysicalOperator[0x10])(&local_40,pPVar1,this->executor->context);
    _Var3._M_p = local_40._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)0x0;
    _Var2._M_head_impl =
         (this->source_state).
         super_unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
         .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl;
    (this->source_state).
    super_unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
    .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl =
         (GlobalSourceState *)_Var3._M_p;
    if (_Var2._M_head_impl != (GlobalSourceState *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_GlobalSourceState + 8))();
    }
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
  }
  return;
}

Assistant:

void Pipeline::ResetSource(bool force) {
	if (source && !source->IsSource()) {
		throw InternalException("Source of pipeline does not have IsSource set");
	}
	if (force || !source_state) {
		source_state = source->GetGlobalSourceState(GetClientContext());
	}
}